

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_NtkDfsUserBoxes(Bac_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  iVar1 = (p->vType).nCap;
  lVar3 = (long)iVar1;
  if (lVar3 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
  }
  if ((p->vCopy).nCap < iVar1) {
    piVar2 = (p->vCopy).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc(lVar3 * 4);
    }
    else {
      piVar2 = (int *)realloc(piVar2,lVar3 * 4);
    }
    (p->vCopy).pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopy).nCap = iVar1;
  }
  if (0 < iVar1) {
    memset((p->vCopy).pArray,0xff,lVar3 << 2);
  }
  (p->vCopy).nSize = iVar1;
  (p->vArray).nSize = 0;
  iVar1 = (p->vType).nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (((p->vType).pArray[lVar3] & 0xfeU) == 10) {
        iVar1 = Bac_NtkDfsUserBoxes_rec(p,(int)lVar3,&p->vArray);
        if (iVar1 == 0) {
          puts("Cyclic dependency of user boxes is detected.");
          return 0;
        }
        iVar1 = (p->vType).nSize;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return 1;
}

Assistant:

int Bac_NtkDfsUserBoxes( Bac_Ntk_t * p )
{
    int iObj;
    Bac_NtkStartCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Vec_IntClear( &p->vArray );
    Bac_NtkForEachBoxUser( p, iObj )
        if ( !Bac_NtkDfsUserBoxes_rec( p, iObj, &p->vArray ) )
        {
            printf( "Cyclic dependency of user boxes is detected.\n" );
            return 0;
        }
    return 1;
}